

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall goodform::form::form(form *this,any *v)

{
  allocator<char> local_31;
  string local_30;
  
  (this->super_sub_form).error_ = &this->error_;
  (this->super_sub_form).variant_ = v;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  error_message::error_message(&this->error_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

form::form(const any& v) : error_(""), sub_form(v, error_)
  {

  }